

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConversionExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConversionExpression,slang::ast::Type_const&,slang::ast::ConversionKind&,slang::ast::Expression&,slang::SourceRange&>
          (BumpAllocator *this,Type *args,ConversionKind *args_1,Expression *args_2,
          SourceRange *args_3)

{
  SourceRange sourceRange;
  ConversionExpression *pCVar1;
  ConversionExpression *in_RCX;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  Type *in_R8;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pCVar1 = (ConversionExpression *)
           allocate((BumpAllocator *)in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  sourceRange.endLoc = in_RSI;
  sourceRange.startLoc = in_RDX;
  slang::ast::ConversionExpression::ConversionExpression
            (in_RCX,in_R8,(ConversionKind)((in_R8->super_Symbol).name._M_len >> 0x20),
             *(Expression **)&in_R8->super_Symbol,sourceRange);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }